

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesPerformanceFactorGetProperties
          (zes_perf_handle_t hPerf,zes_perf_properties_t *pProperties)

{
  zes_pfnPerformanceFactorGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_perf_properties_t *pProperties_local;
  zes_perf_handle_t hPerf_local;
  
  if (*(code **)(*(long *)(hPerf + 8) + 0xa80) == (code *)0x0) {
    hPerf_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPerf_local._4_4_ =
         (**(code **)(*(long *)(hPerf + 8) + 0xa80))(*(undefined8 *)hPerf,pProperties);
  }
  return hPerf_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPerformanceFactorGetProperties(
        zes_perf_handle_t hPerf,                        ///< [in] Handle for the Performance Factor domain.
        zes_perf_properties_t* pProperties              ///< [in,out] Will contain information about the specified Performance
                                                        ///< Factor domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_perf_object_t*>( hPerf )->dditable;
        auto pfnGetProperties = dditable->zes.PerformanceFactor.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPerf = reinterpret_cast<zes_perf_object_t*>( hPerf )->handle;

        // forward to device-driver
        result = pfnGetProperties( hPerf, pProperties );

        return result;
    }